

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O0

boolean set_quant_slots(j_compress_ptr cinfo,char *arg)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  bool bVar2;
  char ch;
  int ci;
  int val;
  char local_21;
  int local_20;
  int local_1c;
  char *local_18;
  long local_10;
  
  local_1c = 0;
  local_20 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    if (9 < local_20) {
      return 1;
    }
    if (*local_18 == '\0') {
      *(int *)(*(long *)(local_10 + 0x58) + (long)local_20 * 0x60 + 0x10) = local_1c;
    }
    else {
      local_21 = ',';
      iVar1 = __isoc99_sscanf(local_18,"%d%c",&local_1c,&local_21);
      if (iVar1 < 1) {
        return 0;
      }
      if (local_21 != ',') {
        return 0;
      }
      if ((local_1c < 0) || (3 < local_1c)) {
        fprintf(_stderr,"JPEG quantization tables are numbered 0..%d\n",3);
        return 0;
      }
      *(int *)(*(long *)(local_10 + 0x58) + (long)local_20 * 0x60 + 0x10) = local_1c;
      do {
        bVar2 = false;
        if (*local_18 != '\0') {
          bVar2 = *local_18 != ',';
          local_18 = local_18 + 1;
        }
      } while (bVar2);
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

GLOBAL(boolean)
set_quant_slots(j_compress_ptr cinfo, char *arg)
/* Process a quantization-table-selectors parameter string, of the form
 *     N[,N,...]
 * If there are more components than parameters, the last value is replicated.
 */
{
  int val = 0;                  /* default table # */
  int ci;
  char ch;

  for (ci = 0; ci < MAX_COMPONENTS; ci++) {
    if (*arg) {
      ch = ',';                 /* if not set by sscanf, will be ',' */
      if (sscanf(arg, "%d%c", &val, &ch) < 1)
        return FALSE;
      if (ch != ',')            /* syntax check */
        return FALSE;
      if (val < 0 || val >= NUM_QUANT_TBLS) {
        fprintf(stderr, "JPEG quantization tables are numbered 0..%d\n",
                NUM_QUANT_TBLS - 1);
        return FALSE;
      }
      cinfo->comp_info[ci].quant_tbl_no = val;
      while (*arg && *arg++ != ','); /* advance to next segment of arg
                                        string */
    } else {
      /* reached end of parameter, set remaining components to last table */
      cinfo->comp_info[ci].quant_tbl_no = val;
    }
  }
  return TRUE;
}